

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void stable_sqrt_sort_common_sort(int **arr,int Len,int **extbuf,int *Tags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int **ppiVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int **ppiVar18;
  int **ppiVar19;
  int iVar20;
  int **ppiVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  undefined8 *puVar28;
  ulong uVar29;
  int *piVar30;
  int *c;
  ulong uVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int **local_b8;
  
  if (Len < 0x10) {
    if (1 < Len) {
      iVar1 = 1;
      uVar7 = 2;
      do {
        uVar16 = (ulong)uVar7;
        do {
          iVar35 = (int)uVar16;
          uVar12 = iVar35 - 1;
          uVar16 = (ulong)uVar12;
          uVar24 = iVar35 - 2;
          piVar30 = arr[uVar24];
          if (*piVar30 <= *arr[uVar16]) break;
          arr[uVar24] = arr[uVar16];
          arr[uVar16] = piVar30;
        } while (1 < (int)uVar12);
        iVar1 = iVar1 + 1;
        uVar7 = uVar7 + 1;
      } while (iVar1 != Len);
    }
  }
  else {
    uVar7 = 1;
    do {
      uVar12 = uVar7;
      uVar16 = (ulong)uVar12;
      uVar7 = uVar12 * 2;
    } while ((int)(uVar12 * uVar12) < Len);
    memcpy(extbuf,arr,uVar16 * 8);
    stable_sqrt_sort_common_sort(extbuf,uVar12,arr,Tags);
    uVar7 = Len - uVar12;
    if (1 < (int)uVar7) {
      uVar11 = 1;
      do {
        iVar35 = *arr[uVar16 + (uVar11 - 1)];
        iVar1 = *arr[uVar16 + uVar11];
        arr[uVar16 + (uVar11 - 3)] = arr[uVar16 + uVar11 + ((ulong)(iVar1 < iVar35) - 1)];
        arr[uVar16 + (uVar11 - 2)] = arr[uVar16 + (uVar11 - (iVar1 < iVar35))];
        uVar11 = uVar11 + 2;
      } while (uVar11 < uVar7);
    }
    lVar4 = (long)(int)uVar7;
    if ((uVar7 & 1) != 0) {
      arr[uVar16 + lVar4 + -3] = arr[uVar16 + lVar4 + -1];
    }
    ppiVar19 = arr + (uVar16 - 2);
    if (2 < (int)uVar12) {
      iVar1 = 2;
      do {
        iVar35 = iVar1 * 2;
        uVar24 = uVar7 + iVar1 * -2;
        lVar23 = 0;
        if (-1 < (int)uVar24) {
          lVar23 = 0;
          ppiVar5 = ppiVar19;
          do {
            stable_sqrt_sort_merge_left_with_x_buf(ppiVar5,iVar1,iVar1,-iVar1);
            lVar23 = lVar23 + iVar35;
            ppiVar5 = ppiVar5 + iVar35;
          } while (lVar23 <= (long)(ulong)uVar24);
        }
        iVar32 = (int)lVar23;
        iVar13 = (uVar7 - iVar32) - iVar1;
        if (iVar13 == 0 || (int)(uVar7 - iVar32) < iVar1) {
          if (iVar32 < (int)uVar7) {
            lVar23 = (long)iVar32;
            do {
              ppiVar19[lVar23 - iVar1] = ppiVar19[lVar23];
              lVar23 = lVar23 + 1;
            } while (lVar4 != lVar23);
          }
        }
        else {
          stable_sqrt_sort_merge_left_with_x_buf(ppiVar19 + iVar32,iVar1,iVar13,-iVar1);
        }
        ppiVar19 = ppiVar19 + -(long)iVar1;
        iVar1 = iVar35;
      } while (iVar35 < (int)uVar12);
    }
    uVar24 = uVar12 * 2;
    iVar1 = (int)uVar7 % (int)uVar24;
    ppiVar5 = ppiVar19 + (int)(uVar7 - iVar1);
    lVar4 = (long)(int)uVar12;
    if (iVar1 - uVar12 == 0 || iVar1 < (int)uVar12) {
      memcpy(ppiVar5 + lVar4,ppiVar5,(long)iVar1 << 3);
    }
    else {
      stable_sqrt_sort_merge_right(ppiVar5,uVar12,iVar1 - uVar12,uVar12);
    }
    if (0 < (int)(uVar7 - iVar1)) {
      iVar35 = (Len - iVar1) - uVar12;
      iVar1 = (Len - iVar1) + uVar12 * -3;
      do {
        stable_sqrt_sort_merge_right(ppiVar19 + iVar1,uVar12,uVar12,uVar12);
        iVar35 = iVar35 + uVar12 * -2;
        iVar1 = iVar1 + uVar12 * -2;
      } while (0 < iVar35);
    }
    if ((int)uVar24 < Len) {
      auVar40 = _DAT_0011c280;
      uVar8 = uVar12;
      do {
        uVar22 = uVar24;
        iVar32 = uVar8 * 4;
        uVar24 = (int)uVar7 / iVar32;
        iVar13 = (int)uVar7 % iVar32;
        iVar35 = iVar13;
        iVar1 = 0;
        if ((int)uVar22 < iVar13) {
          iVar35 = 0;
          iVar1 = iVar13;
        }
        if (-1 < (int)uVar24) {
          uVar11 = (ulong)uVar24;
          iVar13 = 0;
          uVar34 = 0;
          do {
            if ((iVar1 == 0) && (uVar34 == uVar11)) break;
            bVar36 = uVar34 == uVar11;
            iVar9 = iVar32;
            if (bVar36) {
              iVar9 = iVar1;
            }
            uVar6 = (long)iVar9 / (long)(int)uVar12;
            iVar9 = (int)uVar6;
            uVar29 = uVar6 & 0xffffffff;
            if (-1 < (int)(iVar9 + (uint)bVar36)) {
              uVar25 = (ulong)(iVar9 + (uint)bVar36 + 1);
              lVar23 = uVar25 - 1;
              auVar37._8_4_ = (int)lVar23;
              auVar37._0_8_ = lVar23;
              auVar37._12_4_ = (int)((ulong)lVar23 >> 0x20);
              auVar37 = auVar37 ^ auVar40;
              uVar17 = 0;
              auVar38 = _DAT_0011c270;
              do {
                auVar39 = auVar38 ^ auVar40;
                if ((bool)(~(auVar37._4_4_ < auVar39._4_4_ ||
                            auVar37._0_4_ < auVar39._0_4_ && auVar39._4_4_ == auVar37._4_4_) & 1)) {
                  Tags[uVar17] = (int)uVar17;
                }
                if (auVar39._12_4_ <= auVar37._12_4_ &&
                    (auVar39._8_4_ <= auVar37._8_4_ || auVar39._12_4_ != auVar37._12_4_)) {
                  Tags[uVar17 + 1] = (int)uVar17 + 1;
                }
                uVar17 = uVar17 + 2;
                lVar23 = auVar38._8_8_;
                auVar38._0_8_ = auVar38._0_8_ + 2;
                auVar38._8_8_ = lVar23 + 2;
              } while ((uVar25 + 1 & 0xfffffffffffffffe) != uVar17);
            }
            lVar23 = (long)iVar13;
            ppiVar19 = arr + uVar16 + (long)(iVar32 * (int)uVar34);
            if (1 < iVar9) {
              ppiVar5 = arr + uVar16 + lVar23;
              ppiVar18 = arr + lVar4 + uVar16 + lVar23;
              uVar25 = 1;
              do {
                uVar31 = uVar25 - 1 & 0xffffffff;
                ppiVar21 = ppiVar18;
                uVar17 = uVar25;
                do {
                  if ((**ppiVar21 < *ppiVar19[(int)((int)uVar31 * uVar12)]) ||
                     ((*ppiVar19[(int)((int)uVar31 * uVar12)] == **ppiVar21 &&
                      (Tags[uVar17] < Tags[(int)uVar31])))) {
                    uVar31 = uVar17 & 0xffffffff;
                  }
                  uVar17 = uVar17 + 1;
                  ppiVar21 = ppiVar21 + lVar4;
                } while (uVar29 != uVar17);
                iVar20 = (int)uVar31;
                if (uVar25 - 1 != uVar31) {
                  lVar33 = 0;
                  do {
                    piVar30 = ppiVar5[lVar33];
                    ppiVar5[lVar33] = arr[uVar16 + lVar23 + (int)(iVar20 * uVar12) + lVar33];
                    arr[uVar16 + lVar23 + (int)(iVar20 * uVar12) + lVar33] = piVar30;
                    lVar33 = lVar33 + 1;
                  } while (uVar12 != (uint)lVar33);
                  iVar14 = Tags[uVar25 - 1];
                  Tags[uVar25 - 1] = Tags[iVar20];
                  Tags[iVar20] = iVar14;
                }
                uVar25 = uVar25 + 1;
                ppiVar18 = ppiVar18 + lVar4;
                ppiVar5 = ppiVar5 + lVar4;
              } while (uVar25 != uVar29);
            }
            iVar20 = 0;
            iVar14 = 0;
            if (uVar34 == uVar11) {
              iVar14 = iVar1 % (int)uVar12;
            }
            if ((0 < iVar9) && (iVar14 != 0)) {
              puVar28 = (undefined8 *)
                        ((long)arr + (uVar29 - 1) * lVar4 * 8 + lVar23 * 8 + uVar16 * 8);
              uVar25 = 0;
              do {
                if (*(int *)*puVar28 <= *ppiVar19[(int)(iVar9 * uVar12)]) goto LAB_00112249;
                uVar25 = uVar25 + 1;
                puVar28 = puVar28 + -lVar4;
              } while (uVar29 != uVar25);
              uVar25 = uVar6 & 0xffffffff;
LAB_00112249:
              iVar20 = (int)uVar25;
            }
            uVar8 = iVar9 - iVar20;
            if (uVar8 == 0) {
              iVar20 = iVar20 * uVar12;
LAB_001124aa:
              stable_sqrt_sort_merge_left_with_x_buf(ppiVar19,iVar20,iVar14,-uVar12);
            }
            else {
              uVar3 = (uint)((int)uVar22 / (int)uVar12 <= *Tags);
              uVar2 = uVar12;
              uVar10 = uVar12;
              if (1 < (int)uVar8) {
                ppiVar5 = arr + lVar4 + uVar16 + lVar23 + -1;
                local_b8 = arr + uVar16 + lVar23;
                uVar29 = 1;
                uVar6 = (ulong)uVar12;
                do {
                  uVar2 = (uint)uVar6;
                  ppiVar18 = ppiVar19 + (int)(uVar10 - uVar2);
                  if (uVar3 == (int)uVar22 / (int)uVar12 <= Tags[uVar29]) {
                    memcpy(ppiVar18 + -lVar4,ppiVar18,(long)(int)uVar2 << 3);
                    uVar6 = (ulong)uVar12;
                  }
                  else {
                    iVar9 = uVar2 + uVar12;
                    bVar36 = 0 < (int)uVar2;
                    uVar27 = 0;
                    uVar15 = uVar2;
                    if ((0 < (int)uVar12) && (uVar27 = 0, 0 < (int)uVar2)) {
                      ppiVar21 = local_b8 + -(long)(int)uVar2;
                      uVar27 = 0;
                      do {
                        iVar26 = (*ppiVar18[uVar27] + (uVar3 - 1)) - *ppiVar18[uVar6];
                        piVar30 = ppiVar18[uVar27];
                        if (-1 < iVar26) {
                          piVar30 = ppiVar18[uVar6];
                        }
                        uVar27 = uVar27 - (iVar26 >> 0x1f);
                        uVar15 = (uint)(-1 < iVar26) + (int)uVar6;
                        uVar6 = (ulong)uVar15;
                        *ppiVar21 = piVar30;
                        bVar36 = (int)uVar27 < (int)uVar2;
                      } while (((int)uVar27 < (int)uVar2) &&
                              (ppiVar21 = ppiVar21 + 1, (int)uVar15 < iVar9));
                    }
                    if (bVar36) {
                      uVar6 = (ulong)(uVar2 - uVar27);
                      if (uVar2 - uVar27 != 0 && (int)uVar27 <= (int)uVar2) {
                        lVar23 = (long)(int)uVar2;
                        ppiVar18 = ppiVar5;
                        do {
                          lVar23 = lVar23 + -1;
                          ppiVar18[(long)iVar9 - (long)(int)uVar2] = *ppiVar18;
                          ppiVar18 = ppiVar18 + -1;
                        } while ((int)uVar27 < lVar23);
                      }
                    }
                    else {
                      uVar3 = 1 - uVar3;
                      uVar6 = (ulong)(iVar9 - uVar15);
                    }
                  }
                  uVar29 = uVar29 + 1;
                  uVar10 = uVar10 + uVar12;
                  local_b8 = local_b8 + lVar4;
                  ppiVar5 = ppiVar5 + lVar4;
                  uVar2 = (uint)uVar6;
                } while (uVar29 != uVar8);
              }
              uVar8 = uVar10 - uVar2;
              if (iVar14 != 0) {
                if (uVar3 == 0) {
                  iVar20 = uVar2 + iVar20 * uVar12;
                }
                else {
                  memcpy(ppiVar19 + (int)uVar8 + -lVar4,ppiVar19 + (int)uVar8,(long)(int)uVar2 << 3)
                  ;
                  iVar20 = iVar20 * uVar12;
                  uVar8 = uVar10;
                }
                ppiVar19 = ppiVar19 + (int)uVar8;
                goto LAB_001124aa;
              }
              memcpy(ppiVar19 + (int)uVar8 + -lVar4,ppiVar19 + (int)uVar8,(long)(int)uVar2 << 3);
            }
            uVar34 = uVar34 + 1;
            iVar13 = iVar13 + iVar32;
            auVar40 = _DAT_0011c280;
          } while (uVar34 != uVar24 + 1);
        }
        if (0 < (int)(uVar7 - iVar35)) {
          lVar23 = (ulong)(uVar7 - iVar35) + 1;
          do {
            arr[uVar16 + lVar23 + -2] = arr[(uVar16 + lVar23 + -2) - lVar4];
            lVar23 = lVar23 + -1;
          } while (1 < lVar23);
        }
        uVar24 = uVar22 * 2;
        uVar8 = uVar22;
      } while ((int)(uVar22 * 2) < Len);
    }
    uVar24 = -uVar12;
    if ((int)uVar12 < 1) {
      uVar8 = 0;
    }
    else {
      ppiVar19 = arr + (long)(int)uVar24 + uVar16;
      iVar1 = 0;
      uVar8 = 0;
      do {
        if ((uVar8 == uVar7) ||
           (piVar30 = arr[uVar16 + (long)(int)uVar8], *extbuf[iVar1] <= *piVar30)) {
          piVar30 = extbuf[iVar1];
          iVar1 = iVar1 + 1;
        }
        else {
          uVar8 = uVar8 + 1;
        }
        *ppiVar19 = piVar30;
        ppiVar19 = ppiVar19 + 1;
        uVar24 = uVar24 + 1;
      } while (iVar1 < (int)uVar12);
    }
    if ((int)uVar8 < (int)uVar7 && uVar24 != uVar8) {
      lVar23 = 0;
      do {
        arr[(long)(int)uVar24 + uVar16 + lVar23] = arr[(long)(int)uVar8 + uVar16 + lVar23];
        lVar23 = lVar23 + 1;
      } while (((long)Len - (long)(int)uVar8) - lVar4 != lVar23);
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                                  int *Tags) {
  int lblock, cbuf;

  if (Len < 16) {
    SQRT_SORT_SORT_INS(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  SORT_TYPE_CPY(extbuf, arr, lblock);
  SQRT_SORT_COMMON_SORT(extbuf, lblock, arr, Tags);
  SQRT_SORT_BUILD_BLOCKS(arr + lblock, Len - lblock, lblock);
  cbuf = lblock;

  while (Len > (cbuf *= 2)) {
    SQRT_SORT_COMBINE_BLOCKS(arr + lblock, Len - lblock, cbuf, lblock, Tags);
  }

  SQRT_SORT_MERGE_DOWN(arr + lblock, extbuf, Len - lblock, lblock);
}